

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult
testing::internal::EqFailure
          (char *expected_expression,char *actual_expression,String *expected_value,
          String *actual_value,bool ignoring_case)

{
  bool bVar1;
  undefined1 uVar2;
  AssertionResult *this;
  Message *this_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult *in_RDI;
  byte in_R9B;
  AssertionResult AVar3;
  Message msg;
  char *in_stack_ffffffffffffff58;
  String *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  Message *in_stack_ffffffffffffff70;
  AssertionResult *this_01;
  AssertionResult *other;
  AssertionResult local_38 [3];
  
  local_38[0].message_.ptr_._7_1_ = in_R9B & 1;
  other = local_38;
  this_01 = in_RDI;
  Message::Message((Message *)in_RDI);
  this = (AssertionResult *)
         Message::operator<<(in_stack_ffffffffffffff70,
                             (char (*) [11])
                             CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  Message::operator<<(in_stack_ffffffffffffff70,
                      (char **)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  bVar1 = String::operator!=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (bVar1) {
    Message::operator<<(in_stack_ffffffffffffff70,
                        (char (*) [12])CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68)
                       );
    Message::operator<<(in_stack_ffffffffffffff70,
                        (String *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  }
  this_00 = Message::operator<<(in_stack_ffffffffffffff70,
                                (char (*) [12])
                                CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  Message::operator<<(this_00,(char **)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68)
                     );
  if ((local_38[0].message_.ptr_._7_1_ & 1) != 0) {
    Message::operator<<(this_00,(char (*) [17])
                                CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  }
  uVar2 = String::operator!=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if ((bool)uVar2) {
    Message::operator<<(this_00,(char (*) [12])CONCAT17(uVar2,in_stack_ffffffffffffff68));
    Message::operator<<(this_00,(String *)CONCAT17(uVar2,in_stack_ffffffffffffff68));
  }
  AssertionFailure();
  AssertionResult::operator<<(this_01,(Message *)in_RDI);
  AssertionResult::AssertionResult(this,other);
  AssertionResult::~AssertionResult((AssertionResult *)0x1ea08c);
  Message::~Message((Message *)0x1ea096);
  AVar3.message_.ptr_ = extraout_RDX.ptr_;
  AVar3._0_8_ = this_01;
  return AVar3;
}

Assistant:

AssertionResult EqFailure(const char* expected_expression,
                          const char* actual_expression,
                          const String& expected_value,
                          const String& actual_value,
                          bool ignoring_case) {
  Message msg;
  msg << "Value of: " << actual_expression;
  if (actual_value != actual_expression) {
    msg << "\n  Actual: " << actual_value;
  }

  msg << "\nExpected: " << expected_expression;
  if (ignoring_case) {
    msg << " (ignoring case)";
  }
  if (expected_value != expected_expression) {
    msg << "\nWhich is: " << expected_value;
  }

  return AssertionFailure() << msg;
}